

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

void Randomize(Mat *m,float a,float b)

{
  ulong uVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint_fast16_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint_fast16_t uVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar2 = m->c;
  if (m->cstep * (long)iVar2 != 0) {
    pvVar3 = m->data;
    sVar4 = m->cstep;
    uVar9 = 0;
    uVar7 = g_prng_rand_state.c;
    do {
      uVar10 = g_prng_rand_state.i;
      g_prng_rand_state.c = uVar7 - 1;
      uVar11 = 0;
      do {
        iVar5 = (int)uVar10;
        iVar6 = (int)uVar11;
        uVar8 = g_prng_rand_state.s[iVar5 + iVar6 + 9U & 0x3f] +
                g_prng_rand_state.s[iVar5 + iVar6 + 0x28U & 0x3f];
        uVar1 = uVar11 + 1;
        g_prng_rand_state.s[iVar5 + iVar6 & 0x3f] = uVar8;
        if (uVar7 != 0) break;
        bVar12 = uVar11 < 0x1ef;
        uVar11 = uVar1;
      } while (bVar12);
      if (uVar7 == 0) {
        g_prng_rand_state.c = 0x36;
      }
      *(float *)((long)pvVar3 + uVar9 * 4) = (float)uVar8 * 5.421011e-20 * 4.0 + -2.0;
      uVar9 = uVar9 + 1;
      uVar7 = g_prng_rand_state.c;
      g_prng_rand_state.i = uVar10 + uVar1;
    } while (uVar9 < (long)iVar2 * sVar4);
    g_prng_rand_state.i = uVar10 + uVar1;
  }
  return;
}

Assistant:

static void Randomize(ncnn::Mat& m, float a = -2.f, float b = 2.f)
{
    for (size_t i=0; i<m.total(); i++)
    {
        m[i] = RandomFloat(a, b);
    }
}